

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bond.hpp
# Opt level: O0

void __thiscall OpenMD::Bond::~Bond(Bond *this)

{
  Bond *in_RDI;
  
  ~Bond(in_RDI);
  operator_delete(in_RDI,0x98);
  return;
}

Assistant:

virtual ~Bond() {}